

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

uint ** Extra_TruthPerm53(void)

{
  uint uVar1;
  uint **ppuVar2;
  uint **ppuVar3;
  long lVar4;
  long lVar5;
  
  ppuVar2 = (uint **)malloc(0x8800);
  *ppuVar2 = (uint *)(ppuVar2 + 0x100);
  ppuVar3 = ppuVar2 + 0x110;
  lVar4 = 1;
  do {
    ppuVar2[lVar4] = (uint *)ppuVar3;
    lVar4 = lVar4 + 1;
    ppuVar3 = ppuVar3 + 0x10;
  } while (lVar4 != 0x100);
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar1 = Extra_TruthPerm5One((int)lVar4 * 0x1010101,(int)lVar5);
      ppuVar2[lVar4][lVar5] = uVar1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x20);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  return ppuVar2;
}

Assistant:

void ** Extra_ArrayAlloc( int nCols, int nRows, int Size )
{
    void ** pRes;
    char * pBuffer;
    int i;
    assert( nCols > 0 && nRows > 0 && Size > 0 );
    pBuffer = ABC_ALLOC( char, nCols * (sizeof(void *) + nRows * Size) );
    pRes = (void **)pBuffer;
    pRes[0] = pBuffer + nCols * sizeof(void *);
    for ( i = 1; i < nCols; i++ )
        pRes[i] = (void *)((char *)pRes[0] + i * nRows * Size);
    return pRes;
}